

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

size_t mserialize::detail::
       BuiltinSerializer<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_void>
       ::sizeof_elems(long param_1)

{
  size_t sVar1;
  _Rb_tree_node_base *p_Var2;
  size_t sVar3;
  
  sVar3 = 0;
  for (p_Var2 = *(_Rb_tree_node_base **)(param_1 + 0x18);
      p_Var2 != (_Rb_tree_node_base *)(param_1 + 8);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    sVar1 = BuiltinSerializer<std::pair<int_const,int>,void>::serialized_size_impl<0ul,1ul>
                      (p_Var2 + 1);
    sVar3 = sVar3 + sVar1;
  }
  return sVar3;
}

Assistant:

static std::size_t sizeof_elems(
    std::false_type /* value_type is not arithmetic */,
    const Sequence& s
  )
  {
    std::size_t result = 0;
    for (auto&& elem : s)
    {
      result += mserialize::serialized_size<value_type>(elem);
    }
    return result;
  }